

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O2

void __thiscall
GmmLib::Table::UpdatePoolFence(Table *this,GMM_UMD_SYNCCONTEXT *UmdContext,bool ClearNode)

{
  HANDLE pvVar1;
  uint64_t uVar2;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,ClearNode) != 0) {
    (this->BBInfo).BBQueueHandle = (HANDLE)0x0;
    (this->BBInfo).BBFence = 0;
    return;
  }
  pvVar1 = UmdContext->BBFenceObj;
  (this->BBInfo).BBQueueHandle = pvVar1;
  (this->PoolElem->PoolBBInfo).BBQueueHandle = pvVar1;
  uVar2 = UmdContext->BBLastFence + 1;
  (this->BBInfo).BBFence = uVar2;
  (this->PoolElem->PoolBBInfo).BBFence = uVar2;
  return;
}

Assistant:

void GmmLib::Table::UpdatePoolFence(GMM_UMD_SYNCCONTEXT *UmdContext, bool ClearNode)
{
    if(!ClearNode)
    {
        //update both node and pool with current fence/handle
        PoolElem->GetPoolBBInfo().BBQueueHandle =
        BBInfo.BBQueueHandle = UmdContext->BBFenceObj;
        PoolElem->GetPoolBBInfo().BBFence =
        BBInfo.BBFence = UmdContext->BBLastFence + 1; //Save incremented fence value, since DX does it during submission
    }
    else
    {
        //Clear node fence/handle
        BBInfo.BBQueueHandle = 0;
        BBInfo.BBFence       = 0;
    }
}